

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O1

guint8 * p2sc_hex2bin(char *hex,size_t len)

{
  guint8 *pgVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  
  pgVar1 = (guint8 *)g_malloc(len >> 1);
  if (1 < len) {
    uVar2 = 0;
    do {
      bVar3 = 0xf0;
      if ((byte)(hex[uVar2 * 2] - 0x30U) < 0x37) {
        bVar3 = (&DAT_0014e316)[(byte)(hex[uVar2 * 2] - 0x30U)];
      }
      bVar4 = 0xf;
      if ((byte)(hex[uVar2 * 2 + 1] - 0x30U) < 0x37) {
        bVar4 = (&DAT_0014e34d)[(byte)(hex[uVar2 * 2 + 1] - 0x30U)];
      }
      pgVar1[uVar2] = bVar4 | bVar3;
      uVar2 = uVar2 + 1;
    } while (len >> 1 != uVar2);
  }
  return pgVar1;
}

Assistant:

guint8 *p2sc_hex2bin(const char *hex, size_t len) {
    len /= 2;
    guint8 *bin = (guint8 *) g_malloc(len);

    for (size_t i = 0; i < len; ++i)
        bin[i] = (h2b(hex[2 * i]) << 4) + (h2b(hex[2 * i + 1]) & 0xf);

    return bin;
}